

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O0

Var Js::GlobalObject::VEval
              (JavascriptLibrary *library,FrameDisplay *environment,ModuleID moduleID,
              bool strictMode,bool isIndirect,Arguments *args,bool isLibraryCode,
              bool registerDocument,uint32 additionalGrfscr,ScriptContext *debugEvalScriptContext)

{
  Type p_Var1;
  ExecutionInfoManager *this;
  code *pcVar2;
  ScriptContext *pSVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  charcount_t cVar7;
  BOOL BVar8;
  CallFlags e;
  undefined4 *puVar9;
  JavascriptString *this_00;
  undefined4 extraout_var;
  FrameDisplay *pFVar10;
  GlobalObject *pGVar11;
  undefined4 extraout_var_00;
  Var aValue;
  ParseableFunctionInfo *pfi;
  FunctionBody *pFVar12;
  TopLevelEvalFunctionBodyResolveInfo *pTVar13;
  ThreadContext *pTVar14;
  Utf8SourceInfo *pUVar15;
  FunctionProxy *this_01;
  bool local_d6;
  bool local_d5;
  TopLevelEvalFunctionBodyResolveInfo *tbfi;
  uint32 bodyIdCtr;
  FunctionBody *globalBody;
  Utf8SourceInfo *utf8SourceInfo;
  uint32 grfscr;
  bool found;
  bool useEvalMap;
  FastEvalMapString key;
  charcount_t sourceLen;
  char16 *sourceString;
  JavascriptString *argString;
  ScriptFunction *pfuncScript;
  Var evalArg;
  Var varThis;
  bool doRegisterDocument;
  ScriptContext *pSStack_48;
  uint argCount;
  ScriptContext *scriptContext;
  bool registerDocument_local;
  Arguments *pAStack_38;
  bool isLibraryCode_local;
  Arguments *args_local;
  bool isIndirect_local;
  bool strictMode_local;
  FrameDisplay *pFStack_28;
  ModuleID moduleID_local;
  FrameDisplay *environment_local;
  JavascriptLibrary *library_local;
  
  scriptContext._7_1_ = isLibraryCode;
  scriptContext._6_1_ = registerDocument;
  pAStack_38 = args;
  args_local._2_1_ = isIndirect;
  args_local._3_1_ = strictMode;
  args_local._4_4_ = moduleID;
  pFStack_28 = environment;
  environment_local = (FrameDisplay *)library;
  if (library == (JavascriptLibrary *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x22b,"(library)","library");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  pSStack_48 = JavascriptLibrary::GetScriptContext((JavascriptLibrary *)environment_local);
  varThis._4_4_ = SUB84(pAStack_38->Info,0) & 0xffffff;
  if (((ulong)pAStack_38->Info & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x230,"(argCount > 0)","Should always have implicit \'this\'");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  varThis._3_1_ = (scriptContext._6_1_ & 1 & (scriptContext._7_1_ ^ 0xff) & 1) != 0;
  evalArg = JavascriptLibraryBase::GetUndefined((JavascriptLibraryBase *)environment_local);
  if (varThis._4_4_ < 2) {
    library_local =
         (JavascriptLibrary *)
         JavascriptLibraryBase::GetUndefined((JavascriptLibraryBase *)environment_local);
  }
  else {
    pfuncScript = (ScriptFunction *)Arguments::operator[](pAStack_38,1);
    bVar4 = VarIs<Js::JavascriptString>(pfuncScript);
    if (bVar4) {
      ScriptContext::TransitionToDebugModeIfFirstSource(pSStack_48,(Utf8SourceInfo *)0x0);
      argString = (JavascriptString *)0x0;
      this_00 = VarTo<Js::JavascriptString>(pfuncScript);
      iVar5 = (*(this_00->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])();
      key.isLibraryCode = JavascriptString::GetLength(this_00);
      EvalMapStringInternal<true>::EvalMapStringInternal
                ((EvalMapStringInternal<true> *)&grfscr,(FinalizableObject *)this_00,
                 (char16 *)CONCAT44(extraout_var,iVar5),key.isLibraryCode,args_local._4_4_,
                 (uint)(args_local._3_1_ & 1),(uint)(scriptContext._7_1_ & 1));
      bVar4 = VirtualTableInfo<Js::PropertyString>::HasVirtualTable(this_00);
      local_d5 = !bVar4 && debugEvalScriptContext == (ScriptContext *)0x0;
      local_d6 = false;
      if (!bVar4 && debugEvalScriptContext == (ScriptContext *)0x0) {
        local_d6 = ScriptContext::IsInEvalMap
                             (pSStack_48,(FastEvalMapString *)&grfscr,(uint)(args_local._2_1_ & 1),
                              (ScriptFunction **)&argString);
      }
      if ((local_d6 == false) ||
         (((args_local._2_1_ & 1) == 0 &&
          (pFVar10 = ScriptFunction::GetEnvironment((ScriptFunction *)argString),
          pFVar10 != (FrameDisplay *)&NullFrameDisplay)))) {
        utf8SourceInfo._0_4_ = additionalGrfscr | 0x1c02;
        if ((scriptContext._7_1_ & 1) != 0) {
          utf8SourceInfo._0_4_ = additionalGrfscr | 0x21c02;
        }
        if (((uint)utf8SourceInfo & 0x400000) == 0) {
          utf8SourceInfo._0_4_ = (uint)utf8SourceInfo | 0x10;
        }
        pGVar11 = JavascriptLibrary::GetGlobalObject((JavascriptLibrary *)environment_local);
        pSVar3 = pSStack_48;
        p_Var1 = pGVar11->EvalHelper;
        iVar6 = (*(this_00->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])();
        cVar7 = JavascriptString::GetLength(this_00);
        argString = (JavascriptString *)
                    (*p_Var1)(pSVar3,(char16_t *)CONCAT44(extraout_var_00,iVar6),cVar7,
                              args_local._4_4_,(uint)utf8SourceInfo,L"eval code",
                              (uint)(varThis._3_1_ & 1),(uint)(args_local._2_1_ & 1),
                              (uint)(args_local._3_1_ & 1));
        if ((debugEvalScriptContext != (ScriptContext *)0x0) &&
           (BVar8 = CrossSite::NeedMarshalVar(argString,debugEvalScriptContext), BVar8 != 0)) {
          aValue = CrossSite::MarshalVar(debugEvalScriptContext,argString,false);
          argString = (JavascriptString *)VarTo<Js::ScriptFunction>(aValue);
        }
        if ((local_d5) && (local_d6 == false)) {
          ScriptContext::AddToEvalMap
                    (pSStack_48,(FastEvalMapString *)&grfscr,(uint)(args_local._2_1_ & 1),
                     (ScriptFunction *)argString);
        }
      }
      else {
        pFVar12 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)argString);
        pUVar15 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)pFVar12);
        bVar4 = ScriptContext::IsScriptContextInDebugMode(pSStack_48);
        if (((bVar4) && (bVar4 = Utf8SourceInfo::GetIsLibraryCode(pUVar15), !bVar4)) &&
           (bVar4 = Utf8SourceInfo::IsInDebugMode(pUVar15), !bVar4)) {
          Throw::FatalInternalError(-0x7fffbffb);
        }
      }
      if ((((scriptContext._7_1_ & 1) == 0) && (argString != (JavascriptString *)0x0)) &&
         ((bVar4 = ScriptContext::IsTTDRecordModeEnabled(pSStack_48), bVar4 ||
          (bVar4 = ScriptContext::ShouldPerformReplayAction(pSStack_48), bVar4)))) {
        pfi = JavascriptFunction::GetParseableFunctionInfo((JavascriptFunction *)argString);
        pFVar12 = TTD::JsSupport::ForceAndGetFunctionBody(pfi);
        bVar4 = TTD::ScriptContextTTD::IsBodyAlreadyLoadedAtTopLevel
                          (pSStack_48->TTDContextInfo,pFVar12);
        if (!bVar4) {
          tbfi._4_4_ = 0;
          bVar4 = ScriptContext::IsTTDRecordModeEnabled(pSStack_48);
          if (bVar4) {
            pTVar14 = ScriptContext::GetThreadContext(pSStack_48);
            pTVar13 = TTD::EventLog::AddEvalFunction
                                (pTVar14->TTDLog,pFVar12,args_local._4_4_,
                                 (char16 *)CONCAT44(extraout_var,iVar5),key.isLibraryCode,
                                 additionalGrfscr,(bool)(scriptContext._6_1_ & 1),
                                 (uint)(args_local._2_1_ & 1),(uint)(args_local._3_1_ & 1));
            bVar4 = ScriptContext::ShouldPerformRecordAction(pSStack_48);
            if (bVar4) {
              pTVar14 = ScriptContext::GetThreadContext(pSStack_48);
              TTD::EventLog::RecordTopLevelCodeAction
                        (pTVar14->TTDLog,(pTVar13->TopLevelBase).TopLevelBodyCtr);
            }
            tbfi._4_4_ = (pTVar13->TopLevelBase).TopLevelBodyCtr;
          }
          bVar4 = ScriptContext::ShouldPerformReplayAction(pSStack_48);
          if (bVar4) {
            pTVar14 = ScriptContext::GetThreadContext(pSStack_48);
            tbfi._4_4_ = TTD::EventLog::ReplayTopLevelCodeAction(pTVar14->TTDLog);
          }
          TTD::ScriptContextTTD::ProcessFunctionBodyOnLoad
                    (pSStack_48->TTDContextInfo,pFVar12,(FunctionBody *)0x0);
          TTD::ScriptContextTTD::RegisterEvalScript(pSStack_48->TTDContextInfo,pFVar12,tbfi._4_4_);
          bVar4 = ScriptContext::ShouldPerformRecordOrReplayAction(pSStack_48);
          if (bVar4) {
            pUVar15 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)pFVar12);
            Utf8SourceInfo::SetSourceInfoForDebugReplay_TTD(pUVar15,tbfi._4_4_);
          }
          bVar4 = ScriptContext::ShouldPerformReplayDebuggerAction(pSStack_48);
          if (bVar4) {
            pTVar14 = ScriptContext::GetThreadContext(pSStack_48);
            pSVar3 = pSStack_48;
            this = pTVar14->TTDExecutionInfo;
            pUVar15 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)pFVar12);
            TTD::ExecutionInfoManager::ProcessScriptLoad
                      (this,pSVar3,tbfi._4_4_,pFVar12,pUVar15,(CompileScriptException *)0x0);
          }
        }
      }
      if ((DAT_01ea9f0b & 1) != 0) {
        this_01 = ScriptFunction::GetFunctionProxy((ScriptFunction *)argString);
        FunctionProxy::EnsureDeserialized(this_01);
      }
      bVar4 = ScriptFunction::HasSuperReference((ScriptFunction *)argString);
      if (bVar4) {
        e = Js::operator&(SUB84(pAStack_38->Info,3) &
                          (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                           CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                          CallFlags_New),CallFlags_ExtraArg);
        bVar4 = operator!(e);
        if (bVar4) {
          JavascriptError::ThrowSyntaxError(pSStack_48,-0x7ff5fbdc,L"super");
        }
      }
      pGVar11 = JavascriptLibrary::GetGlobalObject((JavascriptLibrary *)environment_local);
      library_local =
           (JavascriptLibrary *)
           ExecuteEvalParsedFunction
                     (pGVar11,(ScriptFunction *)argString,pFStack_28,&evalArg,pSStack_48);
    }
    else {
      library_local = (JavascriptLibrary *)pfuncScript;
    }
  }
  return library_local;
}

Assistant:

Var GlobalObject::VEval(JavascriptLibrary* library, FrameDisplay* environment, ModuleID moduleID, bool strictMode, bool isIndirect,
        Arguments& args, bool isLibraryCode, bool registerDocument, uint32 additionalGrfscr, ScriptContext* debugEvalScriptContext)
    {
        Assert(library);
        ScriptContext* scriptContext = library->GetScriptContext();

        unsigned argCount = args.Info.Count;

        AssertMsg(argCount > 0, "Should always have implicit 'this'");

        bool doRegisterDocument = registerDocument & !isLibraryCode;
        Var varThis = library->GetUndefined();

        if (argCount < 2)
        {
            return library->GetUndefined();
        }

        Var evalArg = args[1];
        if (!VarIs<JavascriptString>(evalArg))
        {
            // "If x is not a string value, return x."
            return evalArg;
        }

#ifdef ENABLE_SCRIPT_DEBUGGING
        // It might happen that no script parsed on this context (scriptContext) till now,
        // so this Eval acts as the first source compile for scriptContext, transition to debugMode as needed
        scriptContext->TransitionToDebugModeIfFirstSource(/* utf8SourceInfo = */ nullptr);
#endif

        ScriptFunction *pfuncScript = nullptr;
        JavascriptString *argString = VarTo<JavascriptString>(evalArg);
        char16 const * sourceString = argString->GetSz();
        charcount_t sourceLen = argString->GetLength();
        FastEvalMapString key(argString, sourceString, sourceLen, moduleID, strictMode, isLibraryCode);


        // PropertyString's buffer references to PropertyRecord's inline buffer, if both PropertyString and PropertyRecord are collected
        // we'll leave the PropertyRecord's interior buffer pointer in the EvalMap. So do not use evalmap if we are evaluating PropertyString
        bool useEvalMap = !VirtualTableInfo<PropertyString>::HasVirtualTable(argString) && debugEvalScriptContext == nullptr; // Don't use the cache in case of debugEval

        bool found = useEvalMap && scriptContext->IsInEvalMap(key, isIndirect, &pfuncScript);
        if (!found || (!isIndirect && pfuncScript->GetEnvironment() != &NullFrameDisplay))
        {
            uint32 grfscr = additionalGrfscr | fscrReturnExpression | fscrEval | fscrEvalCode | fscrGlobalCode;

            if (isLibraryCode)
            {
                grfscr |= fscrIsLibraryCode;
            }

            if (!(grfscr & fscrConsoleScopeEval))
            {
                grfscr |= fscrCanDeferFncParse;
            }

            pfuncScript = library->GetGlobalObject()->EvalHelper(scriptContext, argString->GetSz(), argString->GetLength(), moduleID,
                grfscr, Constants::EvalCode, doRegisterDocument, isIndirect, strictMode);

            if (debugEvalScriptContext != nullptr && CrossSite::NeedMarshalVar(pfuncScript, debugEvalScriptContext))
            {
                // This is console scope scenario. DebugEval script context is on the top of the stack. But we are going
                // to execute the user script from target script context. In order to fix the script context stack we
                // need to marshall the function object.
                pfuncScript = VarTo<ScriptFunction>(CrossSite::MarshalVar(debugEvalScriptContext, pfuncScript));
            }

            if (useEvalMap && !found)
            {
                scriptContext->AddToEvalMap(key, isIndirect, pfuncScript);
            }
        }
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        else
        {
            Js::Utf8SourceInfo* utf8SourceInfo = pfuncScript->GetFunctionBody()->GetUtf8SourceInfo();
            if (scriptContext->IsScriptContextInDebugMode() && !utf8SourceInfo->GetIsLibraryCode() && !utf8SourceInfo->IsInDebugMode())
            {
                // Identifying if any non library function escaped for not being in debug mode.
                Throw::FatalInternalError();
            }
        }
#endif

#if ENABLE_TTD
        //
        //TODO: We may (probably?) want to use the debugger source rundown functionality here instead
        //
        if(!isLibraryCode && pfuncScript != nullptr && (scriptContext->IsTTDRecordModeEnabled() || scriptContext->ShouldPerformReplayAction()))
        {
            //Make sure we have the body and text information available
            FunctionBody* globalBody = TTD::JsSupport::ForceAndGetFunctionBody(pfuncScript->GetParseableFunctionInfo());
            if(!scriptContext->TTDContextInfo->IsBodyAlreadyLoadedAtTopLevel(globalBody))
            {
                uint32 bodyIdCtr = 0;

                if(scriptContext->IsTTDRecordModeEnabled())
                {
                    const TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo* tbfi = scriptContext->GetThreadContext()->TTDLog->AddEvalFunction(globalBody, moduleID, sourceString, sourceLen, additionalGrfscr, registerDocument, isIndirect, strictMode);

                    //We always want to register the top-level load but we don't always need to log the event
                    if(scriptContext->ShouldPerformRecordAction())
                    {
                        scriptContext->GetThreadContext()->TTDLog->RecordTopLevelCodeAction(tbfi->TopLevelBase.TopLevelBodyCtr);
                    }

                    bodyIdCtr = tbfi->TopLevelBase.TopLevelBodyCtr;
                }

                if(scriptContext->ShouldPerformReplayAction())
                {
                    bodyIdCtr = scriptContext->GetThreadContext()->TTDLog->ReplayTopLevelCodeAction();
                }

                //walk global body to (1) add functions to pin set (2) build parent map
                scriptContext->TTDContextInfo->ProcessFunctionBodyOnLoad(globalBody, nullptr);
                scriptContext->TTDContextInfo->RegisterEvalScript(globalBody, bodyIdCtr);

                if(scriptContext->ShouldPerformRecordOrReplayAction())
                {
                    globalBody->GetUtf8SourceInfo()->SetSourceInfoForDebugReplay_TTD(bodyIdCtr);
                }

                if(scriptContext->ShouldPerformReplayDebuggerAction())
                {
                    scriptContext->GetThreadContext()->TTDExecutionInfo->ProcessScriptLoad(scriptContext, bodyIdCtr, globalBody, globalBody->GetUtf8SourceInfo(), nullptr);
                }
            }
        }
#endif

        //We shouldn't be serializing eval functions; unless with -ForceSerialized flag
        if (CONFIG_FLAG(ForceSerialized)) {
            pfuncScript->GetFunctionProxy()->EnsureDeserialized();
        }

        if (pfuncScript->HasSuperReference())
        {
            // Indirect evals cannot have a super reference.
            if (!(args.Info.Flags & CallFlags_ExtraArg))
            {
                JavascriptError::ThrowSyntaxError(scriptContext, ERRSuperInIndirectEval, _u("super"));
            }
        }

        return library->GetGlobalObject()->ExecuteEvalParsedFunction(pfuncScript, environment, varThis, scriptContext);
    }